

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
 __thiscall ninx::parser::Parser::parse_function_definition(Parser *this)

{
  string *this_00;
  pointer pcVar1;
  _Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false> _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  Token *pTVar6;
  FunctionDefinition *this_01;
  ParserException *pPVar7;
  string *in_RSI;
  unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
  argument;
  string id;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  function_body;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id_ptr;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  arguments;
  undefined1 local_b0 [8];
  string local_a8;
  _Alloc_hider local_88;
  undefined1 local_80 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  *apvStack_68 [2];
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  local_58;
  _Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false> local_38;
  
  this_00 = in_RSI + 1;
  pTVar6 = TokenReader::get_token((TokenReader *)this_00);
  if (pTVar6 == (Token *)0x0) {
    pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
    local_a8._M_dataplus._M_p = local_b0 + 0x18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_b0 + 8),"Expected function name, but could not find one.","");
    exception::ParserException::ParserException(pPVar7,(Token *)0x0,in_RSI,(string *)(local_b0 + 8))
    ;
    __cxa_throw(pPVar7,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (*pTVar6->_vptr_Token[2])(pTVar6);
  if (iVar3 != 0) {
    pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
    local_a8._M_dataplus._M_p = local_b0 + 0x18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_b0 + 8),
               "Function name must be alphanumeric, and begin with a letter.","");
    exception::ParserException::ParserException(pPVar7,pTVar6,in_RSI,(string *)(local_b0 + 8));
    __cxa_throw(pPVar7,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  __dynamic_cast(pTVar6,&lexer::token::Token::typeinfo,&lexer::token::Text::typeinfo,0);
  lexer::token::Text::get_identifier_abi_cxx11_((Text *)local_80);
  if (local_80 == (undefined1  [8])0x0) {
    pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
    local_a8._M_dataplus._M_p = local_b0 + 0x18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_b0 + 8),
               "Invalid function name. It must be alphanumeric, and begin with a letter.","");
    exception::ParserException::ParserException(pPVar7,pTVar6,in_RSI,(string *)(local_b0 + 8));
    __cxa_throw(pPVar7,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a8._M_dataplus._M_p = local_b0 + 0x18;
  pcVar1 = ((_Alloc_hider *)local_80)->_M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_b0 + 8),pcVar1,pcVar1 + *(size_type *)((long)local_80 + 8));
  iVar3 = TokenReader::check_limiter((TokenReader *)this_00,'(');
  if (iVar3 != 1) {
    pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
    local_78._M_allocated_capacity = (size_type)(local_80 + 0x18);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 8),"Expected \'(\' but could not find one.","");
    exception::ParserException::ParserException(pPVar7,pTVar6,in_RSI,(string *)(local_80 + 8));
    __cxa_throw(pPVar7,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  TokenReader::get_token((TokenReader *)this_00);
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_head_impl = (FunctionDefinition *)this;
  do {
    iVar3 = TokenReader::check_limiter((TokenReader *)this_00,')');
    if (iVar3 != 0) break;
    parse_function_argument((Parser *)local_b0);
    std::
    vector<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>>>
    ::
    emplace_back<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>>
              ((vector<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>>>
                *)&local_58,
               (unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                *)local_b0);
    iVar4 = TokenReader::check_limiter((TokenReader *)this_00,',');
    if (iVar4 == 1) {
      TokenReader::get_token((TokenReader *)this_00);
    }
    else {
      iVar5 = TokenReader::check_limiter((TokenReader *)this_00,')');
      if (iVar5 != 1) {
        pTVar6 = TokenReader::get_token((TokenReader *)this_00);
        pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
        local_78._M_allocated_capacity = (size_type)(local_80 + 0x18);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_80 + 8),"Another argument or end of arguments expected.","");
        exception::ParserException::ParserException(pPVar7,pTVar6,in_RSI,(string *)(local_80 + 8));
        __cxa_throw(pPVar7,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
    }
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  } while (iVar4 == 1);
  TokenReader::get_token((TokenReader *)this_00);
  _Var2._M_head_impl = local_38._M_head_impl;
  if (iVar3 != -1) {
    parse_block((Parser *)&local_88);
    this_01 = (FunctionDefinition *)operator_new(0xe8);
    local_78._M_allocated_capacity =
         (size_type)
         local_58.
         super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_78._8_8_ =
         local_58.
         super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    apvStack_68[0] =
         (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
          *)local_58.
            super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0 = (undefined1  [8])local_88._M_p;
    local_88._M_p = (pointer)0x0;
    element::FunctionDefinition::FunctionDefinition
              (this_01,(string *)(local_b0 + 8),
               (vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                *)(local_80 + 8),
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)local_b0);
    ((_Var2._M_head_impl)->super_Statement).super_ASTElement._vptr_ASTElement =
         (_func_int **)this_01;
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
    local_b0 = (undefined1  [8])0x0;
    std::
    vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
    ::~vector((vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
               *)(local_80 + 8));
    std::
    vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
    ::~vector(&local_58);
    if (local_a8._M_dataplus._M_p != local_b0 + 0x18) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._0_8_ + 1);
    }
    if (local_80 != (undefined1  [8])0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    }
    return (__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
            )(__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
              )_Var2._M_head_impl;
  }
  pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
  local_78._M_allocated_capacity = (size_type)(local_80 + 0x18);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 8),"Expected \')\' but EOF has been reached.","");
  exception::ParserException::ParserException(pPVar7,(Token *)0x0,in_RSI,(string *)(local_80 + 8));
  __cxa_throw(pPVar7,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<FunctionDefinition> ninx::parser::Parser::parse_function_definition() {
    // Extract the function definition identifier
    auto id_token{reader.get_token()};
    if (!id_token) {
        throw ParserException(id_token, this->origin, "Expected function name, but could not find one.");
    }
    if (id_token->get_type() != Type::TEXT) {
        throw ParserException(id_token, this->origin, "Function name must be alphanumeric, and begin with a letter.");
    }
    auto id_ptr{dynamic_cast<ninx::lexer::token::Text *>(id_token)->get_identifier()};
    if (!id_ptr) {
        throw ParserException(id_token, this->origin,
                              "Invalid function name. It must be alphanumeric, and begin with a letter.");
    }
    std::string id{*id_ptr};

    // Extract the parameters
    if (reader.check_limiter('(') != 1) {
        throw ParserException(id_token, this->origin, "Expected '(' but could not find one.");
    }
    reader.get_token();

    std::vector<std::unique_ptr<FunctionArgument>> arguments;

    // Cycle until a closing parenthesis is found or EOF is reached
    int result;
    while ((result = reader.check_limiter(')')) == 0) {
        auto argument{parse_function_argument()};

        arguments.push_back(std::move(argument));

        if (reader.check_limiter(',') == 1) {
            // Skip the period limiter
            reader.get_token();
        } else if (reader.check_limiter(')') == 1) {
            break;
        } else {
            auto error_token{reader.get_token()};
            throw ParserException(error_token, this->origin, "Another argument or end of arguments expected.");
        }
    }
    reader.get_token(); // Skip the closing parenthesis
    if (result == -1) {
        throw ParserException(nullptr, this->origin, "Expected ')' but EOF has been reached.");
    }

    // Parse the function block
    auto function_body{parse_block()};

    auto function_definition = std::make_unique<FunctionDefinition>(id, std::move(arguments), std::move(function_body));

    return function_definition;
}